

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::vertex_attrib_pointer(NegativeTestContext *ctx)

{
  GLuint index;
  GLbyte offset;
  GLuint vao;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_ENUM is generated if type is not an accepted value.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribPointer(&ctx->super_CallLogWrapper,0,1,0,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  index = NegativeTestContext::getInteger(ctx,0x8869);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,index,1,0x1400,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,0,0x1400,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"GL_INVALID_VALUE is generated if stride is negative.",
             (allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,1,0x1400,'\x01',-1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_OPERATION is generated if type is GL_INT_2_10_10_10_REV or GL_UNSIGNED_INT_2_10_10_10_REV and size is not 4."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,2,0x8d9f,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,2,0x8368,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,4,0x8d9f,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,4,0x8368,'\x01',0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(ctx,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  vao = 0;
  offset = '\x01';
  glu::CallLogWrapper::glGenVertexArrays(&ctx->super_CallLogWrapper,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(&ctx->super_CallLogWrapper,vao);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8892,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&ctx->super_CallLogWrapper,0,1,0x1400,'\x01',0,(allocator<char> *)&offset);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindVertexArray(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&ctx->super_CallLogWrapper,1,&vao);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attrib_pointer (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if type is not an accepted value.");
	ctx.glVertexAttribPointer(0, 1, 0, GL_TRUE, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttribPointer(maxVertexAttribs, 1, GL_BYTE, GL_TRUE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.");
	ctx.glVertexAttribPointer(0, 0, GL_BYTE, GL_TRUE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if stride is negative.");
	ctx.glVertexAttribPointer(0, 1, GL_BYTE, GL_TRUE, -1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if type is GL_INT_2_10_10_10_REV or GL_UNSIGNED_INT_2_10_10_10_REV and size is not 4.");
	ctx.glVertexAttribPointer(0, 2, GL_INT_2_10_10_10_REV, GL_TRUE, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glVertexAttribPointer(0, 2, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glVertexAttribPointer(0, 4, GL_INT_2_10_10_10_REV, GL_TRUE, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glVertexAttribPointer(0, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL.");
	GLuint vao = 0;
	GLbyte offset = 1;
	ctx.glGenVertexArrays(1, &vao);
	ctx.glBindVertexArray(vao);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.glVertexAttribPointer(0, 1, GL_BYTE, GL_TRUE, 0, &offset);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindVertexArray(0);
	ctx.glDeleteVertexArrays(1, &vao);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}